

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O2

bool __thiscall xray_re::xr_file_system::initialize(xr_file_system *this,char *fs_spec,uint flags)

{
  pointer pppVar1;
  bool bVar2;
  xr_reader *r;
  string folder;
  allocator<char> local_83;
  allocator<char> local_82;
  allocator<char> local_81;
  string local_80;
  string local_60;
  string local_40;
  
  if ((fs_spec == (char *)0x0) || (*fs_spec == '\0')) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,PA_FS_ROOT,&local_82);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_83);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_81);
    add_path_alias(this,&local_80,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    r = r_open(this,fs_spec);
    if (r == (xr_reader *)0x0) {
      return false;
    }
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    split_path(fs_spec,&local_80,(string *)0x0,(string *)0x0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,PA_FS_ROOT,&local_82);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_83);
    add_path_alias(this,&local_40,&local_80,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    bVar2 = parse_fs_spec(this,r);
    if ((!bVar2) &&
       (pppVar1 = (this->m_aliases).
                  super__Vector_base<xray_re::xr_file_system::path_alias_*,_std::allocator<xray_re::xr_file_system::path_alias_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       (this->m_aliases).
       super__Vector_base<xray_re::xr_file_system::path_alias_*,_std::allocator<xray_re::xr_file_system::path_alias_*>_>
       ._M_impl.super__Vector_impl_data._M_finish != pppVar1)) {
      (this->m_aliases).
      super__Vector_base<xray_re::xr_file_system::path_alias_*,_std::allocator<xray_re::xr_file_system::path_alias_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = pppVar1;
    }
    (*r->_vptr_xr_reader[1])(r);
  }
  std::__cxx11::string::~string((string *)&local_80);
  this->m_flags = flags;
  return (this->m_aliases).
         super__Vector_base<xray_re::xr_file_system::path_alias_*,_std::allocator<xray_re::xr_file_system::path_alias_*>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->m_aliases).
         super__Vector_base<xray_re::xr_file_system::path_alias_*,_std::allocator<xray_re::xr_file_system::path_alias_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool xr_file_system::initialize(const char* fs_spec, unsigned flags)
{
	if (fs_spec && fs_spec[0] != '\0') {
		xr_reader* r = r_open(fs_spec);
		if (r == 0)
			return false;
			
		std::string folder;
		split_path(fs_spec, &folder);
		add_path_alias(PA_FS_ROOT, folder, "");
		if (!parse_fs_spec(*r))
			this->m_aliases.clear();
		r_close(r);
	} else {
#if 0
		std::string folder;
		get_working_folder(folder);
#endif
		add_path_alias(PA_FS_ROOT, "", "");
	}
	m_flags = flags;
	return !m_aliases.empty();
}